

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> __thiscall
kj::Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>>::
attach<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>>
          (Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>> *this,
          Own<kj::(anonymous_namespace)::SocketAddress::LookupReader> *attachments)

{
  Own<kj::_::PromiseNode> *params;
  Own<kj::(anonymous_namespace)::SocketAddress::LookupReader> *params_00;
  NoInfer<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>_> *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> PVar1;
  Own<kj::(anonymous_namespace)::SocketAddress::LookupReader> local_50;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>_>_>
  local_40;
  Own<kj::_::PromiseNode> local_30;
  NoInfer<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>_> *local_20;
  Own<kj::(anonymous_namespace)::SocketAddress::LookupReader> *attachments_local;
  Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this_local;
  
  local_20 = in_RDX;
  attachments_local = attachments;
  this_local = (Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)this;
  params = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)attachments);
  params_00 = fwd<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>>(local_20);
  tuple<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>>((kj *)&local_50,params_00);
  heap<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>>,kj::Own<kj::_::PromiseNode>,kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>>
            ((kj *)&local_40,params,&local_50);
  Own<kj::_::PromiseNode>::
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>>,void>
            (&local_30,&local_40);
  Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::Promise
            ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)this,false,&local_30);
  Own<kj::_::PromiseNode>::~Own(&local_30);
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>_>_>
  ::~Own(&local_40);
  Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>::~Own(&local_50);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>)PVar1.super_PromiseBase.node
  ;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}